

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

void __thiscall leveldb::Block::Block(Block *this,BlockContents *contents)

{
  ulong uVar1;
  size_t sVar2;
  uint32_t uVar3;
  
  this->data_ = (contents->data).data_;
  uVar1 = (contents->data).size_;
  this->size_ = uVar1;
  this->owned_ = contents->heap_allocated;
  if ((3 < uVar1) && (uVar3 = NumRestarts(this), (ulong)uVar3 <= uVar1 - 4 >> 2)) {
    sVar2 = this->size_;
    uVar3 = NumRestarts(this);
    this->restart_offset_ = (uVar3 * -4 + (int)sVar2) - 4;
    return;
  }
  this->size_ = 0;
  return;
}

Assistant:

Block::Block(const BlockContents& contents)
    : data_(contents.data.data()),
      size_(contents.data.size()),
      owned_(contents.heap_allocated) {
  if (size_ < sizeof(uint32_t)) {
    size_ = 0;  // Error marker
  } else {
    size_t max_restarts_allowed = (size_ - sizeof(uint32_t)) / sizeof(uint32_t);
    if (NumRestarts() > max_restarts_allowed) {
      // The size is too small for NumRestarts()
      size_ = 0;
    } else {
      restart_offset_ = size_ - (1 + NumRestarts()) * sizeof(uint32_t);
    }
  }
}